

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityAssertEqualStringLen
               (char *expected,char *actual,UNITY_UINT32 length,char *msg,UNITY_UINT lineNumber)

{
  ulong uVar1;
  
  if (Unity.CurrentTestIgnored != 0 || Unity.CurrentTestFailed != 0) {
LAB_00102d00:
    longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
  }
  if (actual == (char *)0x0 || expected == (char *)0x0) {
    if (expected != actual) {
LAB_00102ccf:
      Unity.CurrentTestFailed = 1;
      UnityTestResultsFailBegin(lineNumber);
      UnityPrintExpectedAndActualStringsLen(expected,actual,length);
      UnityAddMsgIfSpecified(msg);
      Unity.CurrentTestFailed = 1;
      goto LAB_00102d00;
    }
  }
  else if (length != 0) {
    uVar1 = 0;
    do {
      if (expected[uVar1] == '\0' && actual[uVar1] == '\0') {
        return;
      }
      if (expected[uVar1] != actual[uVar1]) goto LAB_00102ccf;
      uVar1 = uVar1 + 1;
    } while (length != uVar1);
  }
  return;
}

Assistant:

void UnityAssertEqualStringLen(const char* expected,
                               const char* actual,
                               const UNITY_UINT32 length,
                               const char* msg,
                               const UNITY_LINE_TYPE lineNumber)
{
    UNITY_UINT32 i;

    RETURN_IF_FAIL_OR_IGNORE;

    /* if both pointers not null compare the strings */
    if (expected && actual)
    {
        for (i = 0; (i < length) && (expected[i] || actual[i]); i++)
        {
            if (expected[i] != actual[i])
            {
                Unity.CurrentTestFailed = 1;
                break;
            }
        }
    }
    else
    { /* handle case of one pointers being null (if both null, test should pass) */
        if (expected != actual)
        {
            Unity.CurrentTestFailed = 1;
        }
    }

    if (Unity.CurrentTestFailed)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrintExpectedAndActualStringsLen(expected, actual, length);
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }
}